

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

bool __thiscall
despot::option::PrintUsageImplementation::LinePartIterator::next(LinePartIterator *this)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  
  if (this->ptr == (char *)0x0) {
    return false;
  }
  if (this->col == -1) {
    this->col = 0;
    update_length(this);
  }
  else {
    pbVar3 = (byte *)(this->ptr + this->len);
    this->ptr = (char *)pbVar3;
    iVar5 = this->col;
    bVar7 = this->hit_target_line;
    iVar4 = this->target_line_in_block;
    iVar2 = this->max_line_in_block;
    iVar6 = this->line_in_block;
    do {
      while (bVar1 = *pbVar3, 9 < bVar1) {
        if (bVar1 == 10) goto LAB_00164a8e;
        if (bVar1 == 0xb) {
          iVar6 = iVar6 + 1;
          this->line_in_block = iVar6;
          if (iVar2 <= iVar6) {
            iVar2 = iVar6;
          }
          this->max_line_in_block = iVar2;
          goto LAB_00164ad9;
        }
LAB_00164abf:
        pbVar3 = pbVar3 + 1;
LAB_00164ac2:
        this->ptr = (char *)pbVar3;
      }
      if (bVar1 == 0) {
LAB_00164a8e:
        if ((bVar7 & 1) != 0) {
          this->target_line_in_block = iVar4 + 1;
          if (iVar2 <= iVar4) {
            update_length(this);
            return false;
          }
          this->hit_target_line = false;
          iVar6 = 0;
          this->line_in_block = 0;
          this->col = 0;
          bVar7 = 0;
          iVar5 = 0;
          pbVar3 = (byte *)this->rowstart;
          iVar4 = iVar4 + 1;
          goto LAB_00164ac2;
        }
        break;
      }
      if (bVar1 != 9) goto LAB_00164abf;
      if ((bVar7 & 1) == 0) break;
      this->hit_target_line = false;
      this->line_in_block = 0;
      iVar5 = iVar5 + 1;
      this->col = iVar5;
      iVar6 = 0;
      bVar7 = 0;
LAB_00164ad9:
      pbVar3 = pbVar3 + 1;
      this->ptr = (char *)pbVar3;
    } while (iVar6 != iVar4);
    update_length(this);
    this->hit_target_line = true;
  }
  return true;
}

Assistant:

bool next() {
			if (ptr == 0)
				return false;

			if (col == -1) {
				col = 0;
				update_length();
				return true;
			}

			ptr += len;
			while (true) {
				switch (*ptr) {
				case '\v':
					upmax(max_line_in_block, ++line_in_block);
					++ptr;
					break;
				case '\t':
					if (!hit_target_line) // if previous column did not have the targetline
					{   // then "insert" a 0-length part
						update_length();
						hit_target_line = true;
						return true;
					}

					hit_target_line = false;
					line_in_block = 0;
					++col;
					++ptr;
					break;
				case 0:
				case '\n':
					if (!hit_target_line) // if previous column did not have the targetline
					{   // then "insert" a 0-length part
						update_length();
						hit_target_line = true;
						return true;
					}

					if (++target_line_in_block > max_line_in_block) {
						update_length();
						return false;
					}

					hit_target_line = false;
					line_in_block = 0;
					col = 0;
					ptr = rowstart;
					continue;
				default:
					++ptr;
					continue;
				} // switch

				if (line_in_block == target_line_in_block) {
					update_length();
					hit_target_line = true;
					return true;
				}
			} // while
		}